

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O3

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::~OutgoingMessageImpl(OutgoingMessageImpl *this)

{
  int *piVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  piVar1 = (this->fds).ptr;
  if (piVar1 != (int *)0x0) {
    sVar2 = (this->fds).size_;
    (this->fds).ptr = (int *)0x0;
    (this->fds).size_ = 0;
    pAVar3 = (this->fds).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,piVar1,4,sVar2,sVar2,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&this->message);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x128);
  return;
}

Assistant:

OutgoingMessageImpl(TwoPartyVatNetwork& network, uint firstSegmentWordSize)
      : network(network),
        message(firstSegmentWordSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : firstSegmentWordSize) {}